

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandNumGen.cpp
# Opt level: O2

void __thiscall OpenMD::Utils::RandNumGen::RandNumGen(RandNumGen *this,result_type seed)

{
  pointer puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> seeds;
  vector<unsigned_long,_std::allocator<unsigned_long>_> initalSequence;
  seed_seq seq;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->engine);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&seeds,1,(allocator_type *)&local_13a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&initalSequence,1,(allocator_type *)&local_13a0);
  for (puVar1 = initalSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != initalSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    *puVar1 = seed;
    seed = seed + 1;
  }
  std::seed_seq::
  seed_seq<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (&seq,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   )initalSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )initalSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::seed_seq::
  generate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (&seq,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   )seeds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )seeds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,
         *seeds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start);
  memcpy(this,&local_13a0,5000);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&seq);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&initalSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&seeds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

RandNumGen::RandNumGen(result_type seed) {
    int worldRank {};
    int nProcessors {1};

#ifdef IS_MPI
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &nProcessors);
#endif
    result_type result;
    std::vector<result_type> seeds(nProcessors);

#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      std::vector<result_type> initalSequence(nProcessors);
      std::iota(initalSequence.begin(), initalSequence.end(), seed);

      // Generate the seed_seq to initialize the RNG on each processor
      std::seed_seq seq(initalSequence.begin(), initalSequence.end());

      seq.generate(seeds.begin(), seeds.end());
#ifdef IS_MPI
    }

    MPI_Bcast(&seeds[0], nProcessors, MPI_UINT32_T, 0, MPI_COMM_WORLD);
#endif
    result = seeds[worldRank];

    engine = std::mt19937(result);
  }